

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Property::set_attribute(Property *this,Attribute *attrib)

{
  ::std::__cxx11::string::_M_assign((string *)this);
  (this->_attrib)._varying_authored = attrib->_varying_authored;
  (this->_attrib)._variability = attrib->_variability;
  ::std::__cxx11::string::_M_assign((string *)&(this->_attrib)._type_name);
  linb::any::operator=((any *)&(this->_attrib)._var,(any *)&attrib->_var);
  (this->_attrib)._var._blocked = (attrib->_var)._blocked;
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::operator=(&(this->_attrib)._var._ts._samples,&(attrib->_var)._ts._samples);
  (this->_attrib)._var._ts._dirty = (attrib->_var)._ts._dirty;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&(this->_attrib)._paths,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&attrib->_paths);
  AttrMetas::operator=(&(this->_attrib)._metas,&attrib->_metas);
  this->_type = Attrib;
  return;
}

Assistant:

void set_attribute(const Attribute &attrib) {
    _attrib = attrib;
    _type = Type::Attrib;
  }